

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiNode ** __thiscall
Assimp::B3DImporter::to_array<aiNode*>
          (B3DImporter *this,vector<aiNode_*,_std::allocator<aiNode_*>_> *v)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  const_reference ppaVar5;
  ulong local_30;
  size_t i;
  aiNode **p;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *v_local;
  B3DImporter *this_local;
  
  bVar2 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::empty(v);
  if (bVar2) {
    this_local = (B3DImporter *)0x0;
  }
  else {
    sVar3 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(v);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    this_local = (B3DImporter *)operator_new__(uVar4);
    for (local_30 = 0; sVar3 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size(v),
        local_30 < sVar3; local_30 = local_30 + 1) {
      ppaVar5 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[](v,local_30);
      (&(this_local->super_BaseImporter)._vptr_BaseImporter)[local_30] = (_func_int **)*ppaVar5;
    }
  }
  return (aiNode **)this_local;
}

Assistant:

T *B3DImporter::to_array( const vector<T> &v ){
    if( v.empty() ) {
        return 0;
    }
    T *p=new T[ v.size() ];
    for( size_t i=0;i<v.size();++i ){
        p[i]=v[i];
    }
    return p;
}